

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O1

int main(void)

{
  AudioSource source;
  AudioSource AStack_18;
  
  VxSndInit();
  VxSndLoadSound("sound.mp3",&AStack_18);
  VxSndPlaySound(&AStack_18);
  do {
  } while( true );
}

Assistant:

int main() {
    VxSndInit();
    AudioSource source;
    VxSndLoadSound("sound.mp3", &source);

    //Loops endlessly
    VxSndPlaySound(&source);
    while (true);
}